

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.h
# Opt level: O2

SimulationDecPOMDPDiscrete * __thiscall
SimulationDecPOMDPDiscrete::RunSimulations<AgentFullyObservable>
          (SimulationDecPOMDPDiscrete *this,
          vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *agents)

{
  AgentFullyObservable *pAVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  long *plVar5;
  long *in_RDX;
  Index IVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  pointer ppAVar10;
  ulong uVar11;
  Index sI;
  Index joI;
  SimulationDecPOMDPDiscrete *local_c0;
  uint local_b4;
  double specialR;
  double sumR;
  double r;
  string *local_98;
  ulong local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  allocator_type local_70 [32];
  string local_50 [32];
  
  local_c0 = this;
  SimulationResult::SimulationResult
            ((SimulationResult *)this,
             *(int *)&agents[1].
                      super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
             *(int *)((long)&(agents->
                             super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish + 4),
             *(int *)&(agents->
                      super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  local_98 = (string *)(agents + 2);
  for (uVar11 = 0;
      (int)uVar11 <
      *(int *)&(agents->
               super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>).
               _M_impl.super__Vector_impl_data._M_finish; uVar11 = (ulong)((int)uVar11 + 1)) {
    uVar2 = (uint)((ulong)(in_RDX[1] - *in_RDX) >> 3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&aIs,(long)(int)uVar2,local_70)
    ;
    r = 0.0;
    sumR = 0.0;
    pAVar1 = agents[1].
             super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>.
             _M_impl.super__Vector_impl_data._M_start[0x66];
    sI = (**(code **)(*(long *)(pAVar1 + *(long *)(*(long *)pAVar1 + -0xb8)) + 0x160))
                   (pAVar1 + *(long *)(*(long *)pAVar1 + -0xb8));
    if (*(char *)&(agents->
                  super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Simulation::RunSimulation set initial state to ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," ");
      pAVar1 = agents[1].
               super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>.
               _M_impl.super__Vector_impl_data._M_start[0x66];
      plVar5 = (long *)(**(code **)(*(long *)(pAVar1 + *(long *)(*(long *)pAVar1 + -0xb8)) + 0x38))
                                 (pAVar1 + *(long *)(*(long *)pAVar1 + -0xb8),sI);
      (**(code **)(*plVar5 + 0x18))((string *)local_70,plVar5);
      poVar4 = std::operator<<(poVar4,(string *)local_70);
      std::operator<<(poVar4," (avg reward so far ");
      poVar4 = std::ostream::_M_insert<double>(*(double *)local_c0);
      poVar4 = std::operator<<(poVar4,")");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_70);
    }
    uVar9 = (ulong)(~((int)uVar2 >> 0x1f) & uVar2);
    local_90 = uVar11;
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      plVar5 = *(long **)(*in_RDX + uVar7 * 8);
      (**(code **)(*(long *)((long)plVar5 + *(long *)(*plVar5 + -0x18)) + 0x30))
                ((long)plVar5 + *(long *)(*plVar5 + -0x18));
    }
    IVar6 = 0x7fffffff;
    pdVar8 = (double *)0x7fffffff;
    joI = 0x7fffffff;
    ppAVar10 = (pointer)0x0;
    while (ppAVar10 <
           agents[1].
           super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
      specialR = 0.0;
      local_b4 = (uint)ppAVar10;
      for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        uVar2 = SimulationDecPOMDPDiscrete::GetAction
                          ((vector *)agents,(uint)in_RDX,(uint)uVar11,(uint)pdVar8,r,joI,IVar6,sI,
                           pdVar8);
        aIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11] = uVar2;
      }
      ppAVar10 = agents[1].
                 super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (**(code **)(*ppAVar10 + 0x48))(ppAVar10,&aIs);
      uVar2 = local_b4;
      IVar6 = joI;
      pdVar8 = (double *)(ulong)uVar3;
      SimulationDecPOMDPDiscrete::Step
                ((uint)agents,uVar3,(uint *)(ulong)local_b4,&sI,(double *)&joI,&r,specialR);
      ppAVar10 = (pointer)(ulong)(uVar2 + 1);
    }
    SimulationResult::AddReward(sumR);
    uVar11 = local_90;
    if (*(char *)&agents[1].
                  super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
      std::__cxx11::string::string(local_50,local_98);
      SimulationResult::Save(local_c0,local_50);
      std::__cxx11::string::~string(local_50);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&aIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return local_c0;
}

Assistant:

SimulationResult
    RunSimulations(const std::vector<A*> &agents) const
    {
        SimulationResult result(_m_horizon,GetRandomSeed(),GetNrRuns());

        // Run the simulations
        int i;
        for(i=0;i<GetNrRuns();i++)
        {
            Index jaI,sI,joI,prevJoI,prevJaI,prevSI;
            int nr=agents.size(),i;
            std::vector<Index> aIs(nr);

            unsigned int h;
            double r=0,sumR=0,specialR;

            sI = _m_pu->GetDPOMDPD()->SampleInitialState();

            if(GetVerbose())
                std::cout << "Simulation::RunSimulation set initial state to " 
                     << sI << " "
                     << _m_pu->GetDPOMDPD()->GetState(sI)->SoftPrintBrief()
                     << " (avg reward so far " << result.GetAvgReward()
                          << ")" << std::endl;

            for(i=0;i<nr;++i)
                agents[i]->ResetEpisode();

            joI=INT_MAX;
            jaI=INT_MAX;
            prevJoI=INT_MAX;
            prevJaI=INT_MAX;
            prevSI=INT_MAX;
            for(h=0;h<_m_horizon;h++)
            {
                PreActHook(agents,jaI,joI,r,prevJoI,sI,prevJaI,prevSI,h);
                specialR=0;
                // get the action for each particular agent
                for(i=0;i<nr;++i)
                    aIs[i]=GetAction(agents,i,jaI,joI,r,prevJoI,sI,prevJaI, specialR);
                jaI=_m_pu->IndividualToJointActionIndices(aIs);

                prevJoI=joI;
                prevJaI=jaI;
                prevSI=sI;
                Step(jaI, h, sI, joI, r, sumR, specialR);
            }
            
            result.AddReward(sumR);

            if(_m_saveIntermediateResults)
                result.Save(_m_intermediateResultsFilename);
        }
        
        return(result);
    }